

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_int64(sqlite3_stmt *pStmt,int i,sqlite_int64 iValue)

{
  int iVar1;
  Vdbe *in_RDX;
  i64 in_RDI;
  Vdbe *p;
  int rc;
  uint in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  iVar1 = vdbeUnbind(in_RDX,in_stack_ffffffffffffffe4);
  if (iVar1 == 0) {
    sqlite3VdbeMemSetInt64((Mem *)(ulong)in_stack_ffffffffffffffe0,in_RDI);
    sqlite3_mutex_leave((sqlite3_mutex *)0x136628);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_int64(sqlite3_stmt *pStmt, int i, sqlite_int64 iValue){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    sqlite3VdbeMemSetInt64(&p->aVar[i-1], iValue);
    sqlite3_mutex_leave(p->db->mutex);
  }
  return rc;
}